

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_profile.c
# Opt level: O0

void lj_profile_interpreter(lua_State *L)

{
  int iVar1;
  ulong uVar2;
  lua_State *in_RDI;
  int samples;
  uint8_t mask;
  global_State *g;
  ProfileState *ps;
  byte local_19;
  
  iVar1 = profile_state.samples;
  uVar2 = (ulong)(in_RDI->glref).ptr32;
  local_19 = *(byte *)(uVar2 + 0x109) & 0x7f;
  if ((*(byte *)(uVar2 + 0x109) & 0x20) == 0) {
    profile_state.samples = 0;
    *(undefined1 *)(uVar2 + 0x109) = 0x20;
    lj_dispatch_update((global_State *)L);
    (*profile_state.cb)(profile_state.data,in_RDI,iVar1,profile_state.vmstate);
    local_19 = local_19 | *(byte *)(uVar2 + 0x109) & 0x80;
  }
  *(byte *)(uVar2 + 0x109) = local_19;
  lj_dispatch_update((global_State *)L);
  return;
}

Assistant:

void LJ_FASTCALL lj_profile_interpreter(lua_State *L)
{
  ProfileState *ps = &profile_state;
  global_State *g = G(L);
  uint8_t mask;
  profile_lock(ps);
  mask = (g->hookmask & ~HOOK_PROFILE);
  if (!(mask & HOOK_VMEVENT)) {
    int samples = ps->samples;
    ps->samples = 0;
    g->hookmask = HOOK_VMEVENT;
    lj_dispatch_update(g);
    profile_unlock(ps);
    ps->cb(ps->data, L, samples, ps->vmstate);  /* Invoke user callback. */
    profile_lock(ps);
    mask |= (g->hookmask & HOOK_PROFILE);
  }
  g->hookmask = mask;
  lj_dispatch_update(g);
  profile_unlock(ps);
}